

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_parser.h
# Opt level: O0

websocket_packet_info_s websocket_buffer_peek(void *buffer,uint64_t len)

{
  websocket_packet_info_s wVar1;
  char cVar2;
  byte bVar3;
  ulong uVar4;
  uint64_t msg_len;
  uint8_t len_indicator;
  uint8_t mask_l;
  uint8_t mask_f;
  uint64_t len_local;
  void *buffer_local;
  websocket_packet_info_s info;
  
  if (len < 2) {
    buffer_local = (void *)0x0;
    info.packet_length._0_1_ = '\x02';
    info.packet_length._1_1_ = '\0';
    info.packet_length._2_6_ = 0;
  }
  else {
    cVar2 = *(char *)((long)buffer + 1) >> 7;
    info.packet_length._1_1_ = -cVar2;
    cVar2 = cVar2 * -4;
    bVar3 = *(byte *)((long)buffer + 1) & 0x7f;
    if (bVar3 == 0x7e) {
      if (len < 4) {
        buffer_local = (void *)0x0;
        info.packet_length._0_1_ = cVar2 + '\x04';
      }
      else {
        buffer_local = (void *)(ulong)CONCAT11(*(undefined1 *)((long)buffer + 2),
                                               *(undefined1 *)((long)buffer + 3));
        info.packet_length._0_1_ = cVar2 + '\x04';
      }
    }
    else if (bVar3 == 0x7f) {
      if (len < 10) {
        buffer_local = (void *)0x0;
        info.packet_length._0_1_ = cVar2 + '\n';
      }
      else {
        uVar4 = (ulong)*(byte *)((long)buffer + 2) << 0x38;
        buffer_local = (void *)(uVar4 | (ulong)*(byte *)((long)buffer + 3) << 0x30 |
                                (ulong)*(byte *)((long)buffer + 4) << 0x28 |
                                (ulong)*(byte *)((long)buffer + 5) << 0x20 |
                                (ulong)*(byte *)((long)buffer + 6) << 0x18 |
                                (ulong)*(byte *)((long)buffer + 7) << 0x10 |
                                (ulong)*(byte *)((long)buffer + 8) << 8 |
                               (ulong)*(byte *)((long)buffer + 9));
        if (uVar4 >> 0x3e == 0) {
          info.packet_length._0_1_ = cVar2 + '\n';
        }
        else {
          buffer_local = (void *)0x0;
          info.packet_length._0_1_ = '\0';
          info.packet_length._1_1_ = '\0';
        }
      }
    }
    else {
      buffer_local = (void *)(ulong)bVar3;
      info.packet_length._0_1_ = cVar2 + '\x02';
    }
  }
  wVar1.head_length = (char)info.packet_length;
  wVar1.packet_length = (uint64_t)buffer_local;
  wVar1.masked = info.packet_length._1_1_;
  wVar1._10_6_ = info.packet_length._2_6_;
  return wVar1;
}

Assistant:

inline static struct websocket_packet_info_s
websocket_buffer_peek(void *buffer, uint64_t len) {
  if (len < 2) {
    const struct websocket_packet_info_s info = {0 /* packet */, 2 /* head */,
                                                 0 /* masked? */};
    return info;
  }
  const uint8_t mask_f = (((uint8_t *)buffer)[1] >> 7) & 1;
  const uint8_t mask_l = (mask_f << 2);
  uint8_t len_indicator = ((((uint8_t *)buffer)[1]) & 127);
  switch (len_indicator) {
  case 126:
    if (len < 4)
      return (struct websocket_packet_info_s){0, (uint8_t)(4 + mask_l), mask_f};
    return (struct websocket_packet_info_s){
        (uint64_t)websocket_str2u16(((uint8_t *)buffer + 2)),
        (uint8_t)(4 + mask_l), mask_f};
  case 127:
    if (len < 10)
      return (struct websocket_packet_info_s){0, (uint8_t)(10 + mask_l),
                                              mask_f};
    {
      uint64_t msg_len = websocket_str2u64(((uint8_t *)buffer + 2));
      if (msg_len >> 62)
        return (struct websocket_packet_info_s){0, 0, 0};
      return (struct websocket_packet_info_s){msg_len, (uint8_t)(10 + mask_l),
                                              mask_f};
    }
  default:
    return (struct websocket_packet_info_s){len_indicator,
                                            (uint8_t)(2 + mask_l), mask_f};
  }
}